

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O3

Conjuncts *
BuildConjuncts(DdManager *dd,DdNode *node,st__table *distanceTable,st__table *cacheTable,
              int approxDistance,int maxLocalRef,st__table *ghTable,st__table *mintermTable)

{
  int *piVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  Conjuncts *pCVar5;
  Conjuncts *pCVar6;
  DdNode *pDVar7;
  DdNode *g2;
  uint uVar8;
  Conjuncts *factorsNv;
  char *value;
  DdNode *pDVar9;
  int *piVar10;
  uint uVar11;
  ulong uVar12;
  DdNode *pDVar13;
  Conjuncts *__ptr;
  double dVar14;
  double dVar15;
  double *doubleDummy;
  st__table *local_60;
  uint local_54;
  Conjuncts *local_50;
  NodeStat *nodeStat;
  Conjuncts *dummy;
  int outOfMem;
  
  piVar10 = (int *)((ulong)node & 0xfffffffffffffffe);
  if (*piVar10 == 0x7fffffff) {
    pCVar5 = (Conjuncts *)malloc(0x10);
    if (pCVar5 == (Conjuncts *)0x0) goto LAB_0077f6c0;
    pCVar5->g = node;
  }
  else {
    iVar4 = st__lookup(cacheTable,(char *)node,(char **)&dummy);
    if (iVar4 != 0) {
      return dummy;
    }
    local_60 = cacheTable;
    iVar4 = st__lookup(distanceTable,(char *)piVar10,(char **)&nodeStat);
    if (iVar4 == 0) {
      fwrite("Not in table, Something wrong\n",0x1e,1,(FILE *)dd->err);
      dd->errorCode = CUDD_INTERNAL_ERROR;
      return (Conjuncts *)0x0;
    }
    iVar4 = nodeStat->distance;
    if ((int)((ulong)(uint)(maxLocalRef * 2) * 0x55555556 >> 0x20) < nodeStat->localRef) {
      if ((int)((ulong)(uint)(approxDistance * 2) * 0x55555556 >> 0x20) <= iVar4 &&
          (int)((uint)approxDistance >> 2) < iVar4) {
LAB_0077f711:
        uVar2 = *(ulong *)(piVar10 + 6);
        uVar12 = (ulong)((uint)node & 1);
        pDVar9 = (DdNode *)(uVar12 ^ *(ulong *)(piVar10 + 4));
        dVar15 = 0.0;
        if (*(int *)(*(ulong *)(piVar10 + 4) & 0xfffffffffffffffe) != 0x7fffffff) {
          iVar4 = st__lookup(mintermTable,(char *)pDVar9,(char **)&doubleDummy);
          if (iVar4 == 0) goto LAB_0077f883;
          dVar15 = *(double *)CONCAT44(doubleDummy._4_4_,(int)doubleDummy);
        }
        dVar14 = 0.0;
        pDVar13 = (DdNode *)(uVar12 ^ uVar2);
        if (*(int *)(uVar2 & 0xfffffffffffffffe) != 0x7fffffff) {
          iVar4 = st__lookup(mintermTable,(char *)pDVar13,(char **)&doubleDummy);
          if (iVar4 == 0) {
LAB_0077f883:
            fwrite("Not in table: Something wrong\n",0x1e,1,(FILE *)dd->err);
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return (Conjuncts *)0x0;
          }
          dVar14 = *(double *)CONCAT44(doubleDummy._4_4_,(int)doubleDummy);
        }
        local_54 = (uint)(dVar15 < dVar14);
        pDVar7 = pDVar9;
        if (dVar15 < dVar14) {
          pDVar7 = pDVar13;
          pDVar13 = pDVar9;
        }
        if (pDVar7 == zero) {
          factorsNv = (Conjuncts *)0x0;
          uVar8 = 0;
          pDVar9 = pDVar7;
        }
        else {
          pCVar6 = BuildConjuncts(dd,pDVar7,distanceTable,local_60,approxDistance,maxLocalRef,
                                  ghTable,mintermTable);
          if (pCVar6 == (Conjuncts *)0x0) {
            return (Conjuncts *)0x0;
          }
          __ptr = (Conjuncts *)((ulong)pCVar6 ^ 1);
          uVar8 = (uint)pCVar6 & 1;
          factorsNv = pCVar6;
          if (((ulong)pCVar6 & 1) != 0) {
            factorsNv = __ptr;
          }
          piVar1 = (int *)(((ulong)factorsNv->g & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          piVar1 = (int *)(((ulong)factorsNv->h & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          pDVar9 = zero;
          if (pDVar13 == zero) {
            pCVar5 = ZeroCase(dd,node,factorsNv,ghTable,local_60,local_54);
            goto joined_r0x0077fb85;
          }
        }
        uVar11 = 0;
        if (pDVar13 == pDVar9) {
          pCVar5 = (Conjuncts *)0x0;
LAB_0077f992:
          pCVar6 = factorsNv;
          uVar3 = uVar8;
          if (dVar15 < dVar14) {
            pCVar6 = pCVar5;
            pCVar5 = factorsNv;
            uVar3 = uVar11;
            uVar11 = uVar8;
          }
          pDVar9 = dd->vars[*piVar10];
          pDVar13 = cuddBddIteRecur(dd,pDVar9,pCVar6->g,pCVar5->g);
          if (pDVar13 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,pCVar6->g);
            Cudd_RecursiveDeref(dd,pCVar6->h);
            Cudd_RecursiveDeref(dd,pCVar5->g);
            pDVar13 = pCVar5->h;
          }
          else {
            piVar10 = (int *)(((ulong)pDVar13 & 0xfffffffffffffffe) + 4);
            *piVar10 = *piVar10 + 1;
            pDVar7 = cuddBddIteRecur(dd,pDVar9,pCVar6->h,pCVar5->h);
            if (pDVar7 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,pCVar6->g);
              Cudd_RecursiveDeref(dd,pCVar6->h);
              Cudd_RecursiveDeref(dd,pCVar5->g);
              Cudd_RecursiveDeref(dd,pCVar5->h);
            }
            else {
              piVar10 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
              *piVar10 = *piVar10 + 1;
              g2 = cuddBddIteRecur(dd,pDVar9,pCVar6->g,pCVar5->h);
              if (g2 == (DdNode *)0x0) {
                Cudd_RecursiveDeref(dd,pCVar6->h);
                Cudd_RecursiveDeref(dd,pCVar6->g);
                Cudd_RecursiveDeref(dd,pCVar5->g);
                Cudd_RecursiveDeref(dd,pCVar5->h);
                Cudd_RecursiveDeref(dd,pDVar13);
                pDVar13 = pDVar7;
              }
              else {
                piVar10 = (int *)(((ulong)g2 & 0xfffffffffffffffe) + 4);
                *piVar10 = *piVar10 + 1;
                Cudd_RecursiveDeref(dd,pCVar6->g);
                Cudd_RecursiveDeref(dd,pCVar5->h);
                pDVar9 = cuddBddIteRecur(dd,pDVar9,pCVar6->h,pCVar5->g);
                if (pDVar9 != (DdNode *)0x0) {
                  piVar10 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
                  *piVar10 = *piVar10 + 1;
                  Cudd_RecursiveDeref(dd,pCVar6->h);
                  Cudd_RecursiveDeref(dd,pCVar5->g);
                  if (uVar3 != 0) {
                    free(pCVar6);
                  }
                  if (uVar11 != 0) {
                    free(pCVar5);
                  }
                  pCVar5 = CheckInTables(node,pDVar13,pDVar7,g2,pDVar9,ghTable,local_60,&outOfMem);
                  if (outOfMem != 0) {
                    dd->errorCode = CUDD_MEMORY_OUT;
                    Cudd_RecursiveDeref(dd,pDVar13);
                    Cudd_RecursiveDeref(dd,pDVar7);
                    Cudd_RecursiveDeref(dd,g2);
LAB_0077fb55:
                    Cudd_RecursiveDeref(dd,pDVar9);
                    return (Conjuncts *)0x0;
                  }
                  if (pCVar5 == (Conjuncts *)0x0) {
                    pCVar5 = PickOnePair(node,pDVar13,pDVar7,g2,pDVar9,ghTable,local_60);
                    if (pCVar5 == (Conjuncts *)0x0) {
                      dd->errorCode = CUDD_MEMORY_OUT;
                      Cudd_RecursiveDeref(dd,pDVar13);
                      Cudd_RecursiveDeref(dd,pDVar7);
                      Cudd_RecursiveDeref(dd,g2);
                      goto LAB_0077fb55;
                    }
                    if ((pCVar5->g != pDVar13) && (pCVar5->g != pDVar7)) {
                      Cudd_RecursiveDeref(dd,pDVar13);
                      goto LAB_0077fe40;
                    }
                  }
                  else if ((pCVar5->g != pDVar13) && (pCVar5->g != pDVar7)) {
                    Cudd_RecursiveDeref(dd,pDVar13);
                    goto LAB_0077fe40;
                  }
                  Cudd_RecursiveDeref(dd,g2);
                  pDVar7 = pDVar9;
LAB_0077fe40:
                  Cudd_RecursiveDeref(dd,pDVar7);
                  return pCVar5;
                }
                Cudd_RecursiveDeref(dd,pCVar6->g);
                Cudd_RecursiveDeref(dd,pCVar6->h);
                Cudd_RecursiveDeref(dd,pCVar5->g);
                Cudd_RecursiveDeref(dd,pCVar5->h);
                Cudd_RecursiveDeref(dd,pDVar13);
                Cudd_RecursiveDeref(dd,pDVar7);
                pDVar13 = g2;
              }
            }
          }
          Cudd_RecursiveDeref(dd,pDVar13);
          if (uVar3 != 0) {
            free(pCVar6);
          }
        }
        else {
          local_50 = factorsNv;
          pCVar6 = BuildConjuncts(dd,pDVar13,distanceTable,local_60,approxDistance,maxLocalRef,
                                  ghTable,mintermTable);
          pCVar5 = local_50;
          if (pCVar6 != (Conjuncts *)0x0) {
            __ptr = (Conjuncts *)((ulong)pCVar6 ^ 1);
            uVar11 = (uint)pCVar6 & 1;
            pCVar5 = pCVar6;
            if (((ulong)pCVar6 & 1) != 0) {
              pCVar5 = __ptr;
            }
            piVar1 = (int *)(((ulong)pCVar5->g & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            piVar1 = (int *)(((ulong)pCVar5->h & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + 1;
            factorsNv = local_50;
            if (pDVar7 == zero) {
              pCVar5 = ZeroCase(dd,node,pCVar5,ghTable,local_60,local_54);
joined_r0x0077fb85:
              if (((ulong)pCVar6 & 1) == 0) {
                return pCVar5;
              }
              free(__ptr);
              return pCVar5;
            }
            goto LAB_0077f992;
          }
          Cudd_RecursiveDeref(dd,local_50->g);
          Cudd_RecursiveDeref(dd,pCVar5->h);
          uVar11 = uVar8;
        }
        if (uVar11 == 0) {
          return (Conjuncts *)0x0;
        }
        goto LAB_0077fd83;
      }
    }
    else if ((int)((uint)approxDistance >> 2) < iVar4) goto LAB_0077f711;
    pCVar5 = (Conjuncts *)malloc(0x10);
    if (pCVar5 == (Conjuncts *)0x0) {
LAB_0077f6c0:
      dd->errorCode = CUDD_MEMORY_OUT;
      return (Conjuncts *)0x0;
    }
    doubleDummy._0_4_ = 0;
    iVar4 = st__lookup_int(ghTable,(char *)piVar10,(int *)&doubleDummy);
    if (iVar4 == 0) {
      if (lastTimeG == 0) {
        pCVar5->g = node;
        pCVar5->h = one;
        doubleDummy._0_4_ = 1;
        value = (char *)0x1;
      }
      else {
        pCVar5->g = one;
        pCVar5->h = node;
        doubleDummy._0_4_ = 2;
        value = (char *)0x2;
      }
      lastTimeG = (long)(lastTimeG == 0);
      iVar4 = st__insert(ghTable,(char *)piVar10,value);
      if (iVar4 == -10000) {
        dd->errorCode = CUDD_MEMORY_OUT;
LAB_0077fd83:
        free(pCVar5);
        return (Conjuncts *)0x0;
      }
      goto LAB_0077f5a2;
    }
    if ((int)doubleDummy == 1) {
      pCVar5->g = node;
      pCVar5->h = one;
      goto LAB_0077f5a2;
    }
    if ((int)doubleDummy == 3) {
      if (lastTimeG == 0) {
        pCVar5->g = node;
        pCVar5->h = one;
        lastTimeG = 1;
      }
      else {
        pCVar5->g = one;
        pCVar5->h = node;
        lastTimeG = 0;
      }
      goto LAB_0077f5a2;
    }
    pCVar5->g = one;
  }
  pCVar5->h = node;
LAB_0077f5a2:
  return (Conjuncts *)((ulong)pCVar5 | 1);
}

Assistant:

static Conjuncts *
BuildConjuncts(
  DdManager * dd,
  DdNode * node,
  st__table * distanceTable,
  st__table * cacheTable,
  int approxDistance,
  int maxLocalRef,
  st__table * ghTable,
  st__table * mintermTable)
{
    int topid, distance;
    Conjuncts *factorsNv = NULL, *factorsNnv = NULL, *factors;
    Conjuncts *dummy;
    DdNode *N, *Nv, *Nnv, *temp, *g1, *g2, *h1, *h2, *topv;
    double minNv = 0.0, minNnv = 0.0;
    double *doubleDummy;
    int switched =0;
    int outOfMem;
    int freeNv = 0, freeNnv = 0, freeTemp;
    NodeStat *nodeStat;
    int value;

    /* if f is constant, return (f,f) */
    if (Cudd_IsConstant(node)) {
        factors = ABC_ALLOC(Conjuncts, 1);
        if (factors == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        factors->g = node;
        factors->h = node;
        return(FactorsComplement(factors));
    }

    /* If result (a pair of conjuncts) in cache, return the factors. */
    if ( st__lookup(cacheTable, (const char *)node, (char **)&dummy)) {
        factors = dummy;
        return(factors);
    }
    
    /* check distance and local reference count of this node */
    N = Cudd_Regular(node);
    if (! st__lookup(distanceTable, (const char *)N, (char **)&nodeStat)) {
        (void) fprintf(dd->err, "Not in table, Something wrong\n");
        dd->errorCode = CUDD_INTERNAL_ERROR;
        return(NULL);
    }
    distance = nodeStat->distance;

    /* at or below decomposition point, return (f, 1) */
    if (((nodeStat->localRef > maxLocalRef*2/3) &&
         (distance < approxDistance*2/3)) ||
            (distance <= approxDistance/4)) {
        factors = ABC_ALLOC(Conjuncts, 1);
        if (factors == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        /* alternate assigning (f,1) */
        value = 0;
        if ( st__lookup_int(ghTable, (char *)Cudd_Regular(node), &value)) {
            if (value == 3) {
                if (!lastTimeG) {
                    factors->g = node;
                    factors->h = one;
                    lastTimeG = 1;
                } else {
                    factors->g = one;
                    factors->h = node;
                    lastTimeG = 0; 
                }
            } else if (value == 1) {
                factors->g = node;
                factors->h = one;
            } else {
                factors->g = one;
                factors->h = node;
            }
        } else if (!lastTimeG) {
            factors->g = node;
            factors->h = one;
            lastTimeG = 1;
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(node), (char *)(long)value) == st__OUT_OF_MEM) {
                dd->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(factors);
                return NULL;
            }
        } else {
            factors->g = one;
            factors->h = node;
            lastTimeG = 0;
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(node), (char *)(long)value) == st__OUT_OF_MEM) {
                dd->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(factors);
                return NULL;
            }
        }
        return(FactorsComplement(factors));
    }
    
    /* get the children and recur */
    Nv = cuddT(N);
    Nnv = cuddE(N);
    Nv = Cudd_NotCond(Nv, Cudd_IsComplement(node));
    Nnv = Cudd_NotCond(Nnv, Cudd_IsComplement(node));

    /* Choose which subproblem to solve first based on the number of
     * minterms. We go first where there are more minterms.
     */
    if (!Cudd_IsConstant(Nv)) {
        if (! st__lookup(mintermTable, (const char *)Nv, (char **)&doubleDummy)) {
            (void) fprintf(dd->err, "Not in table: Something wrong\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        minNv = *doubleDummy;
    }
    
    if (!Cudd_IsConstant(Nnv)) {
        if (! st__lookup(mintermTable, (const char *)Nnv, (char **)&doubleDummy)) {
            (void) fprintf(dd->err, "Not in table: Something wrong\n");
            dd->errorCode = CUDD_INTERNAL_ERROR;
            return(NULL);
        }
        minNnv = *doubleDummy;
    }
    
    if (minNv < minNnv) {
        temp = Nv;
        Nv = Nnv;
        Nnv = temp;
        switched = 1;
    }

    /* build gt, ht recursively */
    if (Nv != zero) {
        factorsNv = BuildConjuncts(dd, Nv, distanceTable,
                                   cacheTable, approxDistance, maxLocalRef, 
                                   ghTable, mintermTable);
        if (factorsNv == NULL) return(NULL);
        freeNv = FactorsNotStored(factorsNv);
        factorsNv = (freeNv) ? FactorsUncomplement(factorsNv) : factorsNv;
        cuddRef(factorsNv->g);
        cuddRef(factorsNv->h);
        
        /* Deal with the zero case */
        if (Nnv == zero) {
            /* is responsible for freeing factorsNv */
            factors = ZeroCase(dd, node, factorsNv, ghTable,
                               cacheTable, switched);
            if (freeNv) ABC_FREE(factorsNv);
            return(factors);
        }
    }

    /* build ge, he recursively */
    if (Nnv != zero) {
        factorsNnv = BuildConjuncts(dd, Nnv, distanceTable,
                                    cacheTable, approxDistance, maxLocalRef,
                                    ghTable, mintermTable);
        if (factorsNnv == NULL) {
            Cudd_RecursiveDeref(dd, factorsNv->g);
            Cudd_RecursiveDeref(dd, factorsNv->h);
            if (freeNv) ABC_FREE(factorsNv);
            return(NULL);
        }
        freeNnv = FactorsNotStored(factorsNnv);
        factorsNnv = (freeNnv) ? FactorsUncomplement(factorsNnv) : factorsNnv;
        cuddRef(factorsNnv->g);
        cuddRef(factorsNnv->h);
        
        /* Deal with the zero case */
        if (Nv == zero) {
            /* is responsible for freeing factorsNv */
            factors = ZeroCase(dd, node, factorsNnv, ghTable,
                               cacheTable, switched);
            if (freeNnv) ABC_FREE(factorsNnv);
            return(factors);
        }
    }

    /* construct the 2 pairs */
    /* g1 = x*gt + x'*ge; h1 = x*ht + x'*he; */
    /* g2 = x*gt + x'*he; h2 = x*ht + x'*ge */
    if (switched) {
        factors = factorsNnv;
        factorsNnv = factorsNv;
        factorsNv = factors;
        freeTemp = freeNv;
        freeNv = freeNnv;
        freeNnv = freeTemp;
    }

    /* Build the factors for this node. */
    topid = N->index;
    topv = dd->vars[topid];
    
    g1 = cuddBddIteRecur(dd, topv, factorsNv->g, factorsNnv->g);
    if (g1 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }

    cuddRef(g1);

    h1 = cuddBddIteRecur(dd, topv, factorsNv->h, factorsNnv->h);
    if (h1 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }

    cuddRef(h1);

    g2 = cuddBddIteRecur(dd, topv, factorsNv->g, factorsNnv->h);
    if (g2 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }
    cuddRef(g2);
    Cudd_RecursiveDeref(dd, factorsNv->g);
    Cudd_RecursiveDeref(dd, factorsNnv->h);

    h2 = cuddBddIteRecur(dd, topv, factorsNv->h, factorsNnv->g);
    if (h2 == NULL) {
        Cudd_RecursiveDeref(dd, factorsNv->g);
        Cudd_RecursiveDeref(dd, factorsNv->h);
        Cudd_RecursiveDeref(dd, factorsNnv->g);
        Cudd_RecursiveDeref(dd, factorsNnv->h);
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        if (freeNv) ABC_FREE(factorsNv);
        if (freeNnv) ABC_FREE(factorsNnv);
        return(NULL);
    }
    cuddRef(h2);
    Cudd_RecursiveDeref(dd, factorsNv->h);
    Cudd_RecursiveDeref(dd, factorsNnv->g);
    if (freeNv) ABC_FREE(factorsNv);
    if (freeNnv) ABC_FREE(factorsNnv);

    /* check for each pair in tables and choose one */
    factors = CheckInTables(node, g1, h1, g2, h2, ghTable, cacheTable, &outOfMem);
    if (outOfMem) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        Cudd_RecursiveDeref(dd, h2);
        return(NULL);
    }
    if (factors != NULL) {
        if ((factors->g == g1) || (factors->g == h1)) {
            Cudd_RecursiveDeref(dd, g2);
            Cudd_RecursiveDeref(dd, h2);
        } else {
            Cudd_RecursiveDeref(dd, g1);
            Cudd_RecursiveDeref(dd, h1);
        }
        return(factors);
    }

    /* if not in tables, pick one pair */
    factors = PickOnePair(node,g1, h1, g2, h2, ghTable, cacheTable);
    if (factors == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        Cudd_RecursiveDeref(dd, g1);
        Cudd_RecursiveDeref(dd, h1);
        Cudd_RecursiveDeref(dd, g2);
        Cudd_RecursiveDeref(dd, h2);
    } else {
        /* now free what was created and not used */
        if ((factors->g == g1) || (factors->g == h1)) {
            Cudd_RecursiveDeref(dd, g2);
            Cudd_RecursiveDeref(dd, h2);
        } else {
            Cudd_RecursiveDeref(dd, g1);
            Cudd_RecursiveDeref(dd, h1);
        }
    }
        
    return(factors);
    
}